

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::pragma_message(CTcTokenizer *this)

{
  int iVar1;
  tc_toktyp_t tVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  EVP_PKEY_CTX *pEVar6;
  CTcTokString *this_00;
  EVP_PKEY_CTX *src;
  byte *in_RDI;
  bool bVar7;
  size_t startofs;
  tok_embed_ctx *in_stack_ffffffffffffffa8;
  CTcTokenizer *in_stack_ffffffffffffffb0;
  CTcTokString *in_stack_ffffffffffffffb8;
  CTcTokenizer *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  
  pcVar3 = CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8));
  sVar4 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
  pcVar5 = CTcTokString::get_text((CTcTokString *)(in_RDI + 0xa0));
  pEVar6 = (EVP_PKEY_CTX *)CTcTokString::get_text((CTcTokString *)(in_RDI + 0xa0));
  CTcTokString::copy((CTcTokString *)(in_RDI + 0xe0),pEVar6,
                     (EVP_PKEY_CTX *)(pcVar3 + (sVar4 - (long)pcVar5)));
  iVar1 = expand_macros_curline
                    ((CTcTokenizer *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                     (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
                     (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  if (iVar1 == 0) {
    if (((*in_RDI >> 2 & 1) == 0) && ((*in_RDI >> 4 & 1) == 0)) {
      start_new_line(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
      tVar2 = next_on_line_xlat(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      if (tVar2 == TOKT_LPAR) {
        next_on_line_xlat(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      else {
        log_warning(0x271f);
      }
      while( true ) {
        tVar2 = CTcToken::gettyp((CTcToken *)(in_RDI + 0xcc8));
        bVar7 = false;
        if (tVar2 != TOKT_RPAR) {
          tVar2 = CTcToken::gettyp((CTcToken *)(in_RDI + 0xcc8));
          bVar7 = tVar2 != TOKT_EOF;
        }
        if (!bVar7) break;
        tVar2 = CTcToken::gettyp((CTcToken *)(in_RDI + 0xcc8));
        switch(tVar2) {
        case TOKT_SYM:
        case TOKT_SSTR:
        case TOKT_DSTR:
          CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8));
          CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
          msg_str(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,0x29a99e);
          break;
        case TOKT_INT:
          CTcToken::get_int_val((CTcToken *)(in_RDI + 0xcc8));
          msg_long(in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8);
          break;
        default:
        }
        next_on_line_xlat(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      msg_str(in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,0x29a9eb);
      clear_linebuf(in_stack_ffffffffffffffb0);
    }
    else {
      this_00 = (CTcTokString *)(in_RDI + 0xa0);
      pEVar6 = (EVP_PKEY_CTX *)CTcTokString::get_text((CTcTokString *)(in_RDI + 0xe0));
      src = (EVP_PKEY_CTX *)CTcTokString::get_text_len((CTcTokString *)(in_RDI + 0xe0));
      CTcTokString::copy(this_00,pEVar6,src);
    }
  }
  else {
    clear_linebuf(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void CTcTokenizer::pragma_message()
{
    size_t startofs;

    /* 
     *   copy the source line through the "message" token to the macro
     *   expansion buffer - we don't want to expand that part, but we want
     *   it to appear in the expansion, so just copy the original 
     */
    startofs = (curtok_.get_text() + curtok_.get_text_len()
                - linebuf_.get_text());
    expbuf_.copy(linebuf_.get_text(), startofs);

    /* expand macros; don't allow reading additional lines */
    if (expand_macros_curline(FALSE, FALSE, TRUE))
    {
        clear_linebuf();
        return;
    }

    /* 
     *   If we're in normal compilation mode, display the message.  If we're
     *   in preprocess-only mode, simply retain the message in the
     *   preprocessed result, so that it shows up when the result is
     *   compiled.  
     *   
     *   Ignore messages in list-includes mode.  
     */
    if (!pp_only_mode_ && !list_includes_mode_)
    {
        /* set up at the first post-processed token */
        start_new_line(&expbuf_, startofs);

        /* if there's an open paren, skip it */
        if (next_on_line_xlat(0) == TOKT_LPAR)
            next_on_line_xlat(0);
        else
            log_warning(TCERR_BAD_PRAGMA_SYNTAX);

        /* keep going until we reach the closing paren */
        while (curtok_.gettyp() != TOKT_RPAR
               && curtok_.gettyp() != TOKT_EOF)
        {
            /* display this token */
            switch(curtok_.gettyp())
            {
            case TOKT_SSTR:
            case TOKT_DSTR:
            case TOKT_SYM:
                /* display the text of the token */
                msg_str(curtok_.get_text(), curtok_.get_text_len());
                break;

            case TOKT_INT:
                /* display the integer */
                msg_long(curtok_.get_int_val());
                break;

            default:
                /* ignore anything else */
                break;
            }

            /* get the next token */
            next_on_line_xlat(0);
        }

        /* end the line */
        msg_str("\n", 1);
        
        /* remove the message from the result text */
        clear_linebuf();
    }
    else
    {
        /* preprocessing - copy expanded text to line buffer */
        linebuf_.copy(expbuf_.get_text(), expbuf_.get_text_len());
    }
}